

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadSignal(Psr_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int Range;
  int Item;
  Psr_Man_t *p_local;
  
  iVar1 = Psr_ManUtilSkipSpaces(p);
  if (iVar1 == 0) {
    iVar1 = Psr_ManIsDigit(p);
    if (iVar1 == 0) {
      iVar1 = Psr_ManIsChar(p,'{');
      if (iVar1 == 0) {
        iVar1 = Psr_ManReadName(p);
        if (iVar1 == 0) {
          p_local._4_4_ = Psr_ManErrorSet(p,"Error number 13.",0);
        }
        else {
          iVar2 = Psr_ManUtilSkipSpaces(p);
          if (iVar2 == 0) {
            iVar2 = Psr_ManIsChar(p,'[');
            if (iVar2 == 0) {
              p_local._4_4_ = Abc_Var2Lit2(iVar1,0);
            }
            else {
              iVar2 = Psr_ManReadRange(p);
              if (iVar2 == 0) {
                p_local._4_4_ = Psr_ManErrorSet(p,"Error number 15.",0);
              }
              else {
                iVar3 = Psr_ManUtilSkipSpaces(p);
                if (iVar3 == 0) {
                  iVar1 = Psr_NtkAddSlice(p->pNtk,iVar1,iVar2);
                  p_local._4_4_ = Abc_Var2Lit2(iVar1,1);
                }
                else {
                  p_local._4_4_ = Psr_ManErrorSet(p,"Error number 16.",0);
                }
              }
            }
          }
          else {
            p_local._4_4_ = Psr_ManErrorSet(p,"Error number 14.",0);
          }
        }
      }
      else if (p->fUsingTemp2 == 0) {
        p->fUsingTemp2 = 1;
        p_local._4_4_ = Psr_ManReadConcat(p,&p->vTemp2);
        p->fUsingTemp2 = 0;
        if (p_local._4_4_ == 0) {
          p_local._4_4_ = Psr_ManErrorSet(p,"Error number 11.",0);
        }
        else {
          iVar1 = Psr_ManUtilSkipSpaces(p);
          if (iVar1 != 0) {
            p_local._4_4_ = Psr_ManErrorSet(p,"Error number 12.",0);
          }
        }
      }
      else {
        p_local._4_4_ = Psr_ManErrorSet(p,"Cannot read nested concatenations.",0);
      }
    }
    else {
      iVar1 = Psr_ManReadConstant(p);
      if (iVar1 == 0) {
        p_local._4_4_ = Psr_ManErrorSet(p,"Error number 9.",0);
      }
      else {
        iVar2 = Psr_ManUtilSkipSpaces(p);
        if (iVar2 == 0) {
          p_local._4_4_ = Abc_Var2Lit2(iVar1,2);
        }
        else {
          p_local._4_4_ = Psr_ManErrorSet(p,"Error number 10.",0);
        }
      }
    }
  }
  else {
    p_local._4_4_ = Psr_ManErrorSet(p,"Error number 8.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadSignal( Psr_Man_t * p )
{
    int Item;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 8.", 0);
    if ( Psr_ManIsDigit(p) )
    {
        Item = Psr_ManReadConstant(p);
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 9.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 10.", 0);
        return Abc_Var2Lit2( Item, BAC_PRS_CONST );
    }
    if ( Psr_ManIsChar(p, '{') )
    {
        if ( p->fUsingTemp2 )               return Psr_ManErrorSet(p, "Cannot read nested concatenations.", 0);
        p->fUsingTemp2 = 1;
        Item = Psr_ManReadConcat(p, &p->vTemp2);
        p->fUsingTemp2 = 0;
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 11.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 12.", 0);
        return Item;
    }
    else
    {
        Item = Psr_ManReadName( p );
        if ( Item == 0 )                    return Psr_ManErrorSet(p, "Error number 13.", 0);    // was        return 1;                
        if ( Psr_ManUtilSkipSpaces(p) )     return Psr_ManErrorSet(p, "Error number 14.", 0);
        if ( Psr_ManIsChar(p, '[') )
        {
            int Range = Psr_ManReadRange(p);
            if ( Range == 0 )               return Psr_ManErrorSet(p, "Error number 15.", 0);
            if ( Psr_ManUtilSkipSpaces(p) ) return Psr_ManErrorSet(p, "Error number 16.", 0);
            return Abc_Var2Lit2( Psr_NtkAddSlice(p->pNtk, Item, Range), BAC_PRS_SLICE );
        }
        return Abc_Var2Lit2( Item, BAC_PRS_NAME );
    }
}